

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O1

string * Eof(string *__return_storage_ptr__,string *FileName)

{
  ifstream ResultReader;
  istream local_220 [520];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::ifstream::ifstream(local_220,(string *)FileName,_S_in);
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            (local_220,(string *)__return_storage_ptr__,-1);
  std::ifstream::~ifstream(local_220);
  return __return_storage_ptr__;
}

Assistant:

std::string Eof(std::string FileName)
{
    std::string Results;
    std::ifstream ResultReader(FileName);
    std::getline(ResultReader, Results, (char)std::char_traits<char>::eof());
    return Results;
}